

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmWin.c
# Opt level: O0

void Sfm_NtkDfs_rec(Sfm_Ntk_t *p,int iNode,Vec_Int_t *vNodes,Vec_Wec_t *vGroups,Vec_Int_t *vGroupMap
                   ,Vec_Int_t *vBoxesLeft)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *vGroup;
  int iGroup;
  int k;
  int iFanin;
  int i;
  Vec_Int_t *vBoxesLeft_local;
  Vec_Int_t *vGroupMap_local;
  Vec_Wec_t *vGroups_local;
  Vec_Int_t *vNodes_local;
  int iNode_local;
  Sfm_Ntk_t *p_local;
  
  iVar1 = Sfm_ObjIsPi(p,iNode);
  if ((iVar1 == 0) && (iVar1 = Sfm_ObjIsTravIdCurrent(p,iNode), iVar1 == 0)) {
    iVar1 = Vec_IntEntry(vGroupMap,iNode);
    if (iVar1 < 0) {
      Sfm_ObjSetTravIdCurrent(p,iNode);
      for (k = 0; iVar1 = Sfm_ObjFaninNum(p,iNode), k < iVar1; k = k + 1) {
        iVar1 = Sfm_ObjFanin(p,iNode,k);
        Sfm_NtkDfs_rec(p,iVar1,vNodes,vGroups,vGroupMap,vBoxesLeft);
      }
      Vec_IntPush(vNodes,iNode);
    }
    else {
      iVar1 = Vec_IntEntry(vGroupMap,iNode);
      iVar1 = Abc_Lit2Var(iVar1);
      p_00 = Vec_WecEntry(vGroups,iVar1);
      for (k = 0; iVar2 = Vec_IntSize(p_00), k < iVar2; k = k + 1) {
        iVar2 = Vec_IntEntry(p_00,k);
        iVar2 = Sfm_ObjIsNode(p,iVar2);
        if (iVar2 == 0) {
          __assert_fail("Sfm_ObjIsNode(p, iNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmWin.c"
                        ,0x94,
                        "void Sfm_NtkDfs_rec(Sfm_Ntk_t *, int, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
      }
      for (k = 0; iVar2 = Vec_IntSize(p_00), k < iVar2; k = k + 1) {
        iVar2 = Vec_IntEntry(p_00,k);
        Sfm_ObjSetTravIdCurrent(p,iVar2);
      }
      for (k = 0; iVar2 = Vec_IntSize(p_00), k < iVar2; k = k + 1) {
        iVar2 = Vec_IntEntry(p_00,k);
        for (vGroup._4_4_ = 0; iVar3 = Sfm_ObjFaninNum(p,iVar2), vGroup._4_4_ < iVar3;
            vGroup._4_4_ = vGroup._4_4_ + 1) {
          iVar3 = Sfm_ObjFanin(p,iVar2,vGroup._4_4_);
          Sfm_NtkDfs_rec(p,iVar3,vNodes,vGroups,vGroupMap,vBoxesLeft);
        }
      }
      for (k = 0; iVar2 = Vec_IntSize(p_00), k < iVar2; k = k + 1) {
        iVar2 = Vec_IntEntry(p_00,k);
        Vec_IntPush(vNodes,iVar2);
      }
      Vec_IntPush(vBoxesLeft,iVar1);
    }
  }
  return;
}

Assistant:

void Sfm_NtkDfs_rec( Sfm_Ntk_t * p, int iNode, Vec_Int_t * vNodes, Vec_Wec_t * vGroups, Vec_Int_t * vGroupMap, Vec_Int_t * vBoxesLeft )
{
    int i, iFanin;
    if ( Sfm_ObjIsPi(p, iNode) )
        return;
    if ( Sfm_ObjIsTravIdCurrent(p, iNode) )
        return;
    if ( Vec_IntEntry(vGroupMap, iNode) >= 0 )
    {
        int k, iGroup = Abc_Lit2Var( Vec_IntEntry(vGroupMap, iNode) );
        Vec_Int_t * vGroup = Vec_WecEntry( vGroups, iGroup );
        Vec_IntForEachEntry( vGroup, iNode, i )
            assert( Sfm_ObjIsNode(p, iNode) );
        Vec_IntForEachEntry( vGroup, iNode, i )
            Sfm_ObjSetTravIdCurrent( p, iNode );
        Vec_IntForEachEntry( vGroup, iNode, i )
            Sfm_ObjForEachFanin( p, iNode, iFanin, k )
                Sfm_NtkDfs_rec( p, iFanin, vNodes, vGroups, vGroupMap, vBoxesLeft );
        Vec_IntForEachEntry( vGroup, iNode, i )
            Vec_IntPush( vNodes, iNode );
        Vec_IntPush( vBoxesLeft, iGroup );
    }
    else
    {
        Sfm_ObjSetTravIdCurrent(p, iNode);
        Sfm_ObjForEachFanin( p, iNode, iFanin, i )
            Sfm_NtkDfs_rec( p, iFanin, vNodes, vGroups, vGroupMap, vBoxesLeft );
        Vec_IntPush( vNodes, iNode );
    }
}